

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O3

idx puppup::movegen::__impl::orthogonal(idx step,idx cursor,Gaddag *gaddag,State *state)

{
  ulong uVar1;
  ulong uVar2;
  pointer pNVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  idx iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  uVar1 = cursor + step;
  if (((state->board)._M_elems[uVar1] == 0x1b) &&
     (*(long *)((long)state + (cursor - step) * 8 + 8) == 0x1b)) {
    return 0;
  }
  pNVar3 = (gaddag->nodes_).
           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = *(long *)(board::letter_multiplier + cursor * 8) * (state->letter_score)._M_elems[cursor];
  lVar6 = (pNVar3->children)._M_elems[(state->board)._M_elems[cursor]];
  if (uVar1 < 0xf1 && (uVar1 & 0x800000000000000f) != 0xf) {
    lVar10 = 0;
    lVar9 = 0;
    while ((*(long *)(board::word_multiplier + uVar1 * 8 + lVar10 * 8) != 0 &&
           (lVar11 = (state->board)._M_elems[uVar1 + lVar10], lVar11 != 0x1b))) {
      lVar6 = pNVar3[lVar6].children._M_elems[lVar11];
      if (lVar6 == -1) {
        return -1;
      }
      lVar8 = lVar8 + (state->letter_score)._M_elems[uVar1 + lVar10];
      lVar9 = lVar9 + 1;
      uVar2 = cursor + step * 2 + lVar10;
      if ((0xf0 < uVar2) || (lVar10 = lVar10 + step, (uVar2 & 0x800000000000000f) == 0xf)) break;
    }
  }
  else {
    lVar9 = 0;
  }
  lVar6 = pNVar3[lVar6].children._M_elems[0x1f];
  if (lVar6 == -1) {
    return -1;
  }
  if ((ulong)(cursor - step) < 0xf1 && (cursor - step & 0x800000000000000fU) != 0xf) {
    lVar10 = 0;
    lVar11 = cursor * 8 + step * -8;
    do {
      if ((*(long *)(board::word_multiplier + lVar11 + lVar10 * 8) == 0) ||
         (lVar4 = *(long *)((long)state + lVar10 * 8 + lVar11 + 8), lVar4 == 0x1b))
      goto LAB_0010b629;
      lVar6 = pNVar3[lVar6].children._M_elems[lVar4];
      if (lVar6 == -1) {
        return -1;
      }
      lVar8 = lVar8 + *(long *)((long)state + lVar10 * 8 + lVar11 + 0x808);
      uVar1 = cursor + step * -2 + lVar10;
      if (0xf0 < uVar1) break;
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 - step;
    } while ((uVar1 & 0x800000000000000f) != 0xf);
  }
  else {
LAB_0010b629:
    if (lVar9 == 0) {
      bVar5 = true;
      goto LAB_0010b751;
    }
  }
  if ((gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] == -1) {
    return -1;
  }
  bVar5 = false;
LAB_0010b751:
  iVar7 = 0;
  if (!bVar5) {
    iVar7 = lVar8 * *(long *)(board::word_multiplier + cursor * 8);
  }
  return iVar7;
}

Assistant:

idx orthogonal(idx step, idx cursor, const trie::Gaddag& gaddag,
               const board::State& state) {
    if (state.board[cursor + step] == emptiness &&
        state.board[cursor - step] == emptiness) {
        return 0;
    }
    const idx orig_cursor = cursor;
    idx score = state.letter_score[cursor] * board::letter_multiplier[cursor];

    chr node = gaddag.get(0, state.board[cursor]);
    cursor += step;
    idx depth = 0;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (!gaddag.has(node, trie::rev_marker)) return -1;
    node = gaddag.get(node, trie::rev_marker);
    step = -step;
    cursor = orig_cursor + step;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (depth > 0 && !gaddag.exists(node)) return -1;
    score *= board::word_multiplier[orig_cursor];
    if (depth == 0) score = 0;
    return score;
}